

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void basic_suite::test_true(void)

{
  bool value;
  value_type input [1];
  iarchive in;
  bool local_ab [2];
  uchar local_a9 [1];
  iarchive local_a8;
  
  local_a9[0] = 0x81;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[1]>(&local_a8,&local_a9);
  local_ab[0] = false;
  trial::protocol::bintoken::iarchive::load<bool>(&local_a8,local_ab);
  local_ab[1] = true;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x2b,"void basic_suite::test_true()",local_ab,local_ab + 1);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_true()
{
    const value_type input[] = { token::code::true_value };
    format::iarchive in(input);
    bool value = false;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, true);
}